

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O2

int XNVCTRLQueryTargetStringAttribute
              (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,
              char **ptr)

{
  int iVar1;
  XExtDisplayInfo *info;
  undefined1 *puVar2;
  char *pcVar3;
  _func_int__XDisplay_ptr *p_Var4;
  CARD32 CVar5;
  int target_id_local;
  int target_type_local;
  xnvCtrlQueryStringAttributeReply rep;
  
  target_id_local = target_id;
  target_type_local = target_type;
  info = find_display(dpy);
  if (info == (XExtDisplayInfo *)0x0 || ptr == (char **)0x0) {
    return 0;
  }
  if (info->codes == (XExtCodes *)0x0) {
    return 0;
  }
  XNVCTRLCheckTargetData(dpy,info,&target_type_local,&target_id_local);
  if (dpy->lock_fns != (_XLockPtrs *)0x0) {
    (*dpy->lock_fns->lock_display)(dpy);
  }
  puVar2 = (undefined1 *)_XGetRequest(dpy,4,0x10);
  *puVar2 = (char)info->codes->major_opcode;
  puVar2[1] = 4;
  *(undefined2 *)(puVar2 + 6) = (undefined2)target_type_local;
  *(undefined2 *)(puVar2 + 4) = (undefined2)target_id_local;
  *(uint *)(puVar2 + 8) = display_mask;
  *(uint *)(puVar2 + 0xc) = attribute;
  iVar1 = _XReply(dpy,&rep,0,0);
  if (iVar1 != 0) {
    pcVar3 = (char *)malloc((long)(int)rep.n);
    *ptr = pcVar3;
    if (pcVar3 != (char *)0x0) {
      _XRead(dpy,pcVar3,(long)(int)rep.n);
      if ((rep.n & 3) != 0) {
        _XEatData(dpy,4 - (ulong)(rep.n & 3));
      }
      if (dpy->lock_fns != (_XLockPtrs *)0x0) {
        (*dpy->lock_fns->unlock_display)(dpy);
      }
      p_Var4 = dpy->synchandler;
      CVar5 = rep.flags;
      goto LAB_001053f7;
    }
    _XEatData(dpy,(long)(int)rep.length);
  }
  if (dpy->lock_fns != (_XLockPtrs *)0x0) {
    (*dpy->lock_fns->unlock_display)(dpy);
  }
  p_Var4 = dpy->synchandler;
  CVar5 = 0;
LAB_001053f7:
  if (p_Var4 != (_func_int__XDisplay_ptr *)0x0) {
    (*p_Var4)(dpy);
  }
  return CVar5;
}

Assistant:

Bool XNVCTRLQueryTargetStringAttribute (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,
    char **ptr
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlQueryStringAttributeReply rep;
    xnvCtrlQueryStringAttributeReq   *req;
    Bool exists;
    int length, numbytes, slop;

    if (!ptr) return False;

    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);
    XNVCTRLCheckTargetData(dpy, info, &target_type, &target_id);

    LockDisplay (dpy);
    GetReq (nvCtrlQueryStringAttribute, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlQueryStringAttribute;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    if (!_XReply (dpy, (xReply *) &rep, 0, False)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    length = rep.length;
    numbytes = rep.n;
    slop = numbytes & 3;
    *ptr = (char *) Xmalloc(numbytes);
    if (! *ptr) {
        _XEatData(dpy, length);
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    } else {
        _XRead(dpy, (char *) *ptr, numbytes);
        if (slop) _XEatData(dpy, 4-slop);
    }
    exists = rep.flags;
    UnlockDisplay (dpy);
    SyncHandle ();
    return exists;
}